

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFontAtlas::GlyphRangesBuilder::BuildRanges
          (GlyphRangesBuilder *this,ImVector<unsigned_short> *out_ranges)

{
  bool bVar1;
  bool local_31;
  value_type_conflict2 local_22;
  value_type_conflict2 local_20;
  value_type_conflict2 local_1e;
  int local_1c;
  ImVector<unsigned_short> *pIStack_18;
  int n;
  ImVector<unsigned_short> *out_ranges_local;
  GlyphRangesBuilder *this_local;
  
  pIStack_18 = out_ranges;
  out_ranges_local = (ImVector<unsigned_short> *)this;
  for (local_1c = 0; local_1c < 0x10000; local_1c = local_1c + 1) {
    bVar1 = GetBit(this,local_1c);
    if (bVar1) {
      local_1e = (value_type_conflict2)local_1c;
      ImVector<unsigned_short>::push_back(pIStack_18,&local_1e);
      while( true ) {
        local_31 = false;
        if (local_1c < 0x10000) {
          local_31 = GetBit(this,local_1c + 1);
        }
        if (local_31 == false) break;
        local_1c = local_1c + 1;
      }
      local_20 = (value_type_conflict2)local_1c;
      ImVector<unsigned_short>::push_back(pIStack_18,&local_20);
    }
  }
  local_22 = 0;
  ImVector<unsigned_short>::push_back(pIStack_18,&local_22);
  return;
}

Assistant:

void ImFontAtlas::GlyphRangesBuilder::BuildRanges(ImVector<ImWchar>* out_ranges)
{
    for (int n = 0; n < 0x10000; n++)
        if (GetBit(n))
        {
            out_ranges->push_back((ImWchar)n);
            while (n < 0x10000 && GetBit(n + 1))
                n++;
            out_ranges->push_back((ImWchar)n);
        }
    out_ranges->push_back(0);
}